

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O3

void __thiscall amrex::ParmParse::PP_entry::PP_entry(PP_entry *this,PP_entry *pe)

{
  pointer pcVar1;
  list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *__x;
  list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *this_00;
  
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar1 = (pe->m_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (pe->m_name)._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_vals,&pe->m_vals);
  this->m_table = (Table *)0x0;
  this->m_queried = pe->m_queried;
  __x = pe->m_table;
  if (__x != (list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *)0x0) {
    this_00 = (list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *)
              operator_new(0x18);
    std::__cxx11::list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>::
    list(this_00,__x);
    this->m_table = this_00;
  }
  return;
}

Assistant:

ParmParse::PP_entry::PP_entry (const PP_entry& pe)
    : m_name(pe.m_name),
      m_vals(pe.m_vals),
      m_table(0),
      m_queried(pe.m_queried)
{
    if ( pe.m_table )
    {
        m_table = new Table(*pe.m_table);
    }
}